

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall Clasp::Solver::resetHeuristic(Solver *this,Solver *s,DecisionHeuristic *h,Type t)

{
  unsigned_long __tmp;
  undefined **ppuVar1;
  long *plVar2;
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> local_20;
  
  if ((s != (Solver *)0x0) &&
     (plVar2 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe), plVar2 != (long *)0x0)) {
    (**(code **)(*plVar2 + 0x20))(plVar2,this);
  }
  ppuVar1 = &null_heuristic_g;
  if (h != (DecisionHeuristic *)0x0) {
    ppuVar1 = (undefined **)h;
  }
  local_20.ptr_ = (this->heuristic_).ptr_;
  (this->heuristic_).ptr_ = (ulong)(t == Acquire && h != (DecisionHeuristic *)0x0) | (ulong)ppuVar1;
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::~SingleOwnerPtr(&local_20);
  return;
}

Assistant:

void Solver::resetHeuristic(Solver* s, DecisionHeuristic* h, Ownership_t::Type t) {
	if (s && heuristic_.get()) { heuristic_->detach(*this); }
	if (!h) { h = &null_heuristic_g; t = Ownership_t::Retain; }
	HeuristicPtr(h, t).swap(heuristic_);
}